

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::(anonymous_namespace)::VisibilityToKeyword_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,SymbolVisibility *visibility)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if (*(int *)this == 1) {
    __s = "local ";
    __a = &local_a;
  }
  else if (*(int *)this == 2) {
    __s = "export ";
    __a = &local_9;
  }
  else {
    __s = "";
    __a = &local_b;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string VisibilityToKeyword(const SymbolVisibility& visibility) {
  switch (visibility) {
    case SymbolVisibility::VISIBILITY_EXPORT:
      return "export ";
      break;
    case SymbolVisibility::VISIBILITY_LOCAL:
      return "local ";
      break;
    default:
      break;
  }
  return "";
}